

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEExecOptions.h
# Opt level: O2

void __thiscall CEExecOptions::SetProgName(CEExecOptions *this,string *prog_name)

{
  string vers_str;
  allocator local_7a;
  allocator local_79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::operator+(&local_78,prog_name," v");
  std::operator+(&local_38,&local_78,"1.3.0-TEST");
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::operator=((string *)&this->prog_name_,(string *)prog_name);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_78,"",&local_79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_58,"",&local_7a);
  CLOptions::AddVersionInfo(&this->super_CLOptions,&local_38,&local_78,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_7a);
  std::__cxx11::string::~string((string *)&local_78);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_79);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

inline
void CEExecOptions::SetProgName(const std::string& prog_name)
{
    std::string vers_str = prog_name + " v" + CPPEPHEM_VERSION;
    prog_name_ = prog_name;
    AddVersionInfo(vers_str);
}